

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_enum_support.cpp
# Opt level: O0

char * Am_Enum_To_String_Helper(Am_ID_Tag type,long value)

{
  int iVar1;
  undefined4 extraout_var;
  undefined1 local_38 [8];
  Am_Value v;
  Am_Type_Support *support;
  long value_local;
  char *pcStack_10;
  Am_ID_Tag type_local;
  
  v.value.wrapper_value = (Am_Wrapper *)Am_Find_Support(type);
  if (v.value.wrapper_value == (Am_Wrapper *)0x0) {
    pcStack_10 = (char *)0x0;
  }
  else {
    Am_Value::Am_Value((Am_Value *)local_38,value,type);
    iVar1 = (*((v.value.wrapper_value)->super_Am_Registered_Type)._vptr_Am_Registered_Type[1])
                      (v.value.wrapper_value,(Am_Value *)local_38);
    pcStack_10 = (char *)CONCAT44(extraout_var,iVar1);
    Am_Value::~Am_Value((Am_Value *)local_38);
  }
  return pcStack_10;
}

Assistant:

const char *
Am_Enum_To_String_Helper(Am_ID_Tag type, long value)
{
  Am_Type_Support *support = Am_Find_Support(type);
  if (support) {
    Am_Value v(value, type);
    return support->To_String(v);
  } else
    return nullptr;
}